

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O2

void Tests::AddInstructionEvaluionFail(char *reason)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = instructionEvaluionFails;
  uVar6 = (ulong)instructionEvaluionFails;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (uVar6 * 0x10 + 0x10 == lVar5 + 0x10) {
      if (uVar1 < 0x80) {
        pcVar4 = strdup(reason);
        (&instructionEvaluionFailInfo)[uVar6 * 2] = pcVar4;
        (&DAT_003ea6c8)[uVar6 * 4] = 1;
        instructionEvaluionFails = uVar1 + 1;
        return;
      }
      __assert_fail("instructionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xec,"void Tests::AddInstructionEvaluionFail(const char *)");
    }
    iVar3 = strcmp(*(char **)((long)&instructionEvaluionFailInfo + lVar5),reason);
    lVar2 = lVar5 + 0x10;
  } while (iVar3 != 0);
  *(int *)((long)&DAT_003ea6c8 + lVar5) = *(int *)((long)&DAT_003ea6c8 + lVar5) + 1;
  return;
}

Assistant:

void AddInstructionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < instructionEvaluionFails; i++)
		{
			if(strcmp(instructionEvaluionFailInfo[i].reason, reason) == 0)
			{
				instructionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(instructionEvaluionFails < 128);

		if(instructionEvaluionFails < 128)
		{
			instructionEvaluionFailInfo[instructionEvaluionFails].reason = strdup(reason);
			instructionEvaluionFailInfo[instructionEvaluionFails].count = 1;
			instructionEvaluionFails++;
		}
	}